

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O2

void Gia_ManFraSupports(Gia_ManFra_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *vNodes;
  int i;
  int i_00;
  
  pVVar3 = Vec_PtrStart(p->pPars->nFrames);
  p->vIns = pVVar3;
  pVVar3 = Vec_PtrStart(p->pPars->nFrames);
  p->vAnds = pVVar3;
  pVVar3 = Vec_PtrStart(p->pPars->nFrames);
  p->vOuts = pVVar3;
  Gia_ManIncrementTravId(p->pAig);
  i = p->pPars->nFrames;
  p_01 = (Vec_Int_t *)0x0;
  do {
    if (i < 1) {
      return;
    }
    p_00 = Gia_ManCollectPoIds(p->pAig);
    if (p_01 != (Vec_Int_t *)0x0) {
      for (i_00 = 0; i_00 < p_01->nSize; i_00 = i_00 + 1) {
        pGVar1 = p->pAig;
        iVar2 = Vec_IntEntry(p_01,i_00);
        pGVar4 = Gia_ManObj(pGVar1,iVar2);
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        iVar2 = Gia_ObjIsRo(p->pAig,pGVar4);
        if (iVar2 != 0) {
          pGVar1 = p->pAig;
          pGVar4 = Gia_ObjRoToRi(pGVar1,pGVar4);
          iVar2 = Gia_ObjId(pGVar1,pGVar4);
          Vec_IntPush(p_00,iVar2);
        }
      }
    }
    i = i + -1;
    p_01 = Vec_IntAlloc(100);
    Gia_ManCollectCis(p->pAig,p_00->pArray,p_00->nSize,p_01);
    vNodes = Vec_IntAlloc(100);
    Gia_ManCollectAnds(p->pAig,p_00->pArray,p_00->nSize,vNodes,(Vec_Int_t *)0x0);
    Vec_PtrWriteEntry(p->vIns,i,p_01);
    Vec_PtrWriteEntry(p->vAnds,i,vNodes);
    Vec_PtrWriteEntry(p->vOuts,i,p_00);
  } while( true );
}

Assistant:

void Gia_ManFraSupports( Gia_ManFra_t * p )
{
    Vec_Int_t * vIns = NULL, * vAnds, * vOuts;
    Gia_Obj_t * pObj;
    int f, i;
    p->vIns  = Vec_PtrStart( p->pPars->nFrames );
    p->vAnds = Vec_PtrStart( p->pPars->nFrames );
    p->vOuts = Vec_PtrStart( p->pPars->nFrames );
    Gia_ManIncrementTravId( p->pAig );
    for ( f = p->pPars->nFrames - 1; f >= 0; f-- )
    {
        vOuts = Gia_ManCollectPoIds( p->pAig );
        if ( vIns )
        Gia_ManForEachObjVec( vIns, p->pAig, pObj, i )
            if ( Gia_ObjIsRo(p->pAig, pObj) )
                Vec_IntPush( vOuts, Gia_ObjId( p->pAig, Gia_ObjRoToRi(p->pAig, pObj) ) );
        vIns = Vec_IntAlloc( 100 );
        Gia_ManCollectCis( p->pAig, Vec_IntArray(vOuts), Vec_IntSize(vOuts), vIns );
        vAnds = Vec_IntAlloc( 100 );
        Gia_ManCollectAnds( p->pAig, Vec_IntArray(vOuts), Vec_IntSize(vOuts), vAnds, NULL );
        Vec_PtrWriteEntry( p->vIns,  f, vIns );
        Vec_PtrWriteEntry( p->vAnds, f, vAnds );
        Vec_PtrWriteEntry( p->vOuts, f, vOuts );
    }
}